

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O3

int uts_numChildren(Node *parent)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  char *__format;
  double dVar4;
  
  switch(type) {
  case BIN:
    if (parent->height == 0) {
      dVar4 = floor(b_0);
      uVar3 = (uint)dVar4;
      break;
    }
    goto LAB_00102a32;
  case GEO:
switchD_001029f2_caseD_1:
    uVar3 = uts_numChildren_geo(parent);
    break;
  case HYBRID:
    if ((double)parent->height < (double)gen_mx * shiftDepth) goto switchD_001029f2_caseD_1;
LAB_00102a32:
    uVar3 = uts_numChildren_bin(parent);
    break;
  case BALANCED:
    uVar3 = 0;
    if (parent->height < gen_mx) {
      uVar3 = (uint)b_0;
    }
    break;
  default:
    uVar3 = 0;
    printf("*** Error: %s\n","parTreeSearch(): Unknown tree type");
    impl_abort(1);
  }
  if ((parent->height == 0) && (parent->type == 0)) {
    dVar4 = ceil(b_0);
    uVar2 = (uint)dVar4;
    if ((int)uVar3 <= (int)uVar2) {
      return uVar3;
    }
    __format = "*** Number of children of root truncated from %d to %d\n";
    uVar1 = (ulong)uVar2;
  }
  else {
    if (type == BALANCED) {
      return uVar3;
    }
    if ((int)uVar3 < 0x65) {
      return uVar3;
    }
    __format = "*** Number of children truncated from %d to %d\n";
    uVar2 = 100;
    uVar1 = 100;
  }
  printf(__format,(ulong)uVar3,uVar1);
  return uVar2;
}

Assistant:

int uts_numChildren(Node *parent) {
  int numChildren = 0;

  /* Determine the number of children */
  switch (type) {
    case BIN:
      if (parent->height == 0)
        numChildren = (int) floor(b_0);
      else 
        numChildren = uts_numChildren_bin(parent);
      break;
  
    case GEO:
      numChildren = uts_numChildren_geo(parent);
      break;
    
    case HYBRID:
      if (parent->height < shiftDepth * gen_mx)
        numChildren = uts_numChildren_geo(parent);
      else
        numChildren = uts_numChildren_bin(parent);
      break;
    case BALANCED:
      if (parent->height < gen_mx)
        numChildren = (int) b_0;
      break;
    default:
      uts_error("parTreeSearch(): Unknown tree type");
  }
  
  // limit number of children
  // only a BIN root can have more than MAXNUMCHILDREN
  if (parent->height == 0 && parent->type == BIN) {
    int rootBF = (int) ceil(b_0);
    if (numChildren > rootBF) {
      printf("*** Number of children of root truncated from %d to %d\n",
             numChildren, rootBF);
      numChildren = rootBF;
    }
  }
  else if (type != BALANCED) {
    if (numChildren > MAXNUMCHILDREN) {
      printf("*** Number of children truncated from %d to %d\n", 
             numChildren, MAXNUMCHILDREN);
      numChildren = MAXNUMCHILDREN;
    }
  }

  return numChildren;
}